

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::anon_unknown_1::AssertionPrinter::printReconstructedExpression(AssertionPrinter *this)

{
  ostream *poVar1;
  bool bVar2;
  Code _colourCode;
  string local_48;
  Colour local_11;
  AssertionPrinter *pAStack_10;
  Colour colour;
  AssertionPrinter *this_local;
  
  pAStack_10 = this;
  bVar2 = AssertionResult::hasExpandedExpression(this->result);
  if (bVar2) {
    _colourCode = anon_unknown.dwarf_94597::dimColour();
    Colour::Colour(&local_11,_colourCode);
    std::operator<<(this->stream," for: ");
    Colour::~Colour(&local_11);
    poVar1 = this->stream;
    AssertionResult::getExpandedExpression_abi_cxx11_(&local_48,this->result);
    std::operator<<(poVar1,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return;
}

Assistant:

void printReconstructedExpression() const {
        if (result.hasExpandedExpression()) {
            {
                Colour colour(dimColour());
                stream << " for: ";
            }
            stream << result.getExpandedExpression();
        }
    }